

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
calcOrientationHist(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Mat *image,
                   Point2f *tmp,Point2f *center,double *angle)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  Mat tmp_image;
  float local_1dc;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  Point2f local_138;
  Mat *local_130;
  undefined8 local_128;
  undefined4 local_120;
  Mat *local_118;
  undefined8 local_110;
  Mat local_108;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  MatSize local_68;
  size_t *local_60;
  size_t local_58 [2];
  undefined4 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  pdVar6 = (double *)operator_new(0x40);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = pdVar6;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar6 + 8;
  *pdVar6 = 0.0;
  pdVar6[1] = 0.0;
  pdVar6[2] = 0.0;
  pdVar6[3] = 0.0;
  pdVar6[4] = 0.0;
  pdVar6[5] = 0.0;
  pdVar6[6] = 0.0;
  pdVar6[7] = 0.0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar6 + 8;
  local_138 = *tmp;
  cv::getRotationMatrix2D_(*angle,0x3ff0000000000000,local_168);
  local_68.p = (int *)(local_a8 + 8);
  local_a8._0_4_ = 0x42ff4006;
  local_a8._4_4_ = 2;
  local_a8._8_4_ = 2;
  local_a8._12_4_ = 3;
  local_a8._16_16_ = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_60 = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  cv::Mat::Mat(&local_108,2,3,6,local_168,0);
  local_110 = 0;
  local_120 = 0x2010000;
  local_118 = (Mat *)local_a8;
  cv::Mat::copyTo((_OutputArray *)&local_108);
  cv::Mat::~Mat(&local_108);
  cv::Mat::Mat(&local_108);
  local_110 = 0;
  local_120 = 0x1010000;
  local_128 = 0;
  local_138.x = 9.477423e-38;
  local_38 = 0;
  local_48 = 0x1010000;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_130 = &local_108;
  local_118 = image;
  local_40 = local_a8;
  cv::warpAffine();
  fVar12 = tmp->y;
  uVar7 = (ulong)fVar12;
  local_1dc = (float)(uVar7 & 0xffffffff);
  if (local_1dc < fVar12 + 4.0) {
    fVar14 = tmp->x;
    do {
      uVar11 = (ulong)fVar14;
      fVar17 = (float)(uVar11 & 0xffffffff);
      iVar3 = (int)uVar7;
      if (fVar17 < fVar14 + 4.0) {
        do {
          iVar4 = (int)uVar11;
          uVar10 = iVar4 + 1;
          uVar11 = (ulong)uVar10;
          puVar1 = image->data;
          sVar2 = *(image->step).p;
          dVar15 = (double)puVar1[(long)(int)uVar10 + sVar2 * (long)iVar3] -
                   (double)puVar1[(long)(iVar4 + -1) + sVar2 * (long)iVar3];
          dVar16 = (double)puVar1[(long)iVar4 + sVar2 * (long)(iVar3 + 1)] -
                   (double)puVar1[(long)iVar4 + sVar2 * (long)(iVar3 + -1)];
          dVar13 = calAngle(dVar15,dVar16);
          dVar15 = pow(dVar15 * dVar15 + dVar16 * dVar16,0.5);
          iVar4 = (int)(fVar17 - center->x);
          iVar9 = (int)(local_1dc - center->y);
          dVar16 = exp((double)(iVar9 * iVar9 + iVar4 * iVar4) * -0.5 * 0.5 * 0.5);
          uVar5 = (uint)(dVar13 / 45.0);
          if (uVar5 < 10) {
            dVar15 = dVar15 * dVar16 * 0.15915494309189535;
            dVar13 = (dVar13 - (double)(int)(uVar5 * 0x2d)) / 45.0 + -0.5;
            if (dVar13 <= 0.0) {
              dVar13 = ABS(dVar13);
              pdVar6[uVar5] = (1.0 - dVar13 * dVar15) + pdVar6[uVar5];
              pdVar8 = pdVar6 + ((ulong)uVar5 - 1);
              if (uVar5 == 0) {
                pdVar8 = pdVar6 + 7;
              }
            }
            else {
              pdVar6[uVar5] = (1.0 - dVar13) * dVar15 + pdVar6[uVar5];
              pdVar8 = pdVar6 + (ulong)uVar5 + 1;
              if (6 < uVar5) {
                pdVar8 = pdVar6;
              }
            }
            *pdVar8 = dVar13 * dVar15 + *pdVar8;
          }
          fVar17 = (float)uVar10;
          fVar14 = tmp->x;
        } while (fVar17 < fVar14 + 4.0);
        fVar12 = tmp->y;
      }
      local_1dc = (float)(iVar3 + 1U);
      uVar7 = (ulong)(iVar3 + 1U);
    } while (local_1dc < fVar12 + 4.0);
  }
  Normalize(__return_storage_ptr__);
  cv::Mat::~Mat(&local_108);
  cv::Mat::~Mat((Mat *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

vector<double> calcOrientationHist(const Mat& image, const Point2f& tmp, const Point2f& center, const double& angle){
    vector<double> tmpBin(n_cell_bin);
    Mat rot_mat = getRotationMatrix2D(tmp, angle, 1.0);
    Mat tmp_image;
    warpAffine(image, tmp_image, rot_mat, image.size());
    // imshow("test", tmp_image);
    // waitKey(0);

    for(unsigned r = tmp.y; r < tmp.y+cell_width; r++){
        for(unsigned c = tmp.x; c < tmp.x+cell_width; c++){
            double neighborC, neighborR, neighborAngle, neighborParam, neighborMag;
            neighborC = (double)image.at<uchar>(r, c+1) - (double)image.at<uchar>(r, c-1);
            neighborR = (double)image.at<uchar>(r+1, c) - (double)image.at<uchar>(r-1, c);
            neighborAngle = calAngle(neighborC, neighborR);
            neighborMag = pow(neighborC * neighborC + neighborR * neighborR, 0.5);
            neighborMag *= weight(c-center.x, r-center.y, 0.5 * block_width);

            if( 0 <= int(neighborAngle/45) && int(neighborAngle/45) <= 9){
                int bin = neighborAngle/45;
                double proportion = (neighborAngle-bin*45)/45.0 - 0.5;
                // cout << bin << "    " << proportion << "    " << 1-proportion << endl;
                
                if(proportion > 0){
                    tmpBin[bin] += (1-proportion) * neighborMag;
                    if(bin < tmpBin.size()-1){
                        tmpBin[bin+1] += proportion * neighborMag;
                    }
                    else
                        tmpBin[0] += proportion * neighborMag;
                }
                else{
                    tmpBin[bin] += 1-abs(proportion) * neighborMag;
                    if(bin > 0)
                        tmpBin[bin-1] += abs(proportion) * neighborMag;
                    else
                        tmpBin[tmpBin.size()-1] += abs(proportion) * neighborMag;
                }
            }
        }
    }
    Normalize(tmpBin);
    // ReNormalize(tmpBin);
    return tmpBin;
}